

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::RgbaInputFile::FromYca::FromYca
          (FromYca *this,InputFile *inputFile,RgbaChannels rgbaChannels)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  LineOrder *pLVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Rgba *pRVar8;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int i_1;
  int i;
  ptrdiff_t pad;
  Box2i dw;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff48;
  Box<Imath_2_5::Vec2<int>_> *in_stack_ffffffffffffff50;
  Rgba *pRVar9;
  Rgba *local_a8;
  Rgba *local_78;
  Header *in_stack_ffffffffffffff98;
  int local_4c;
  int local_48;
  Vec3<float> local_30;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::mutex::mutex((mutex *)0x13f270);
  *(undefined8 *)(in_RDI + 0x28) = local_10;
  Imath_2_5::Vec3<float>::Vec3((Vec3<float> *)(in_RDI + 0x50));
  *(byte *)(in_RDI + 0x30) = -((local_14 >> 5 & 1) != 0) & 1;
  InputFile::header(*(InputFile **)(in_RDI + 0x28));
  Header::dataWindow((Header *)0x13f2b5);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  *(int *)(in_RDI + 0x34) = local_24;
  *(int *)(in_RDI + 0x38) = local_20;
  *(int *)(in_RDI + 0x3c) = local_18;
  *(int *)(in_RDI + 0x40) = (local_1c - local_24) + 1;
  *(int *)(in_RDI + 0x44) = (local_18 - local_20) + 1;
  *(int *)(in_RDI + 0x48) = local_20 + -0x1d;
  InputFile::header(*(InputFile **)(in_RDI + 0x28));
  pLVar3 = Header::lineOrder((Header *)0x13f331);
  *(LineOrder *)(in_RDI + 0x4c) = *pLVar3;
  InputFile::header(*(InputFile **)(in_RDI + 0x28));
  anon_unknown_1::ywFromHeader(in_stack_ffffffffffffff98);
  Imath_2_5::Vec3<float>::operator=((Vec3<float> *)(in_RDI + 0x50),&local_30);
  uVar4 = anon_unknown_1::cachePadding((long)*(int *)(in_RDI + 0x40) << 3);
  uVar4 = uVar4 >> 3;
  lVar5 = (long)*(int *)(in_RDI + 0x40) + uVar4;
  uVar6 = lVar5 * 0x20;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar6;
  uVar7 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pRVar8 = (Rgba *)operator_new__(uVar7);
  if (uVar6 != 0) {
    local_78 = pRVar8;
    do {
      Rgba::Rgba(local_78);
      local_78 = local_78 + 1;
    } while (local_78 != pRVar8 + lVar5 * 0x20);
  }
  *(Rgba **)(in_RDI + 0x60) = pRVar8;
  for (local_48 = 0; local_48 < 0x1d; local_48 = local_48 + 1) {
    *(ulong *)(in_RDI + 0x68 + (long)local_48 * 8) =
         *(long *)(in_RDI + 0x60) + (long)local_48 * ((long)*(int *)(in_RDI + 0x40) + uVar4) * 8;
  }
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    *(ulong *)(in_RDI + 0x150 + (long)local_4c * 8) =
         *(long *)(in_RDI + 0x60) +
         (long)(local_4c + 0x1d) * ((long)*(int *)(in_RDI + 0x40) + uVar4) * 8;
  }
  uVar4 = (ulong)(*(int *)(in_RDI + 0x40) + 0x1a);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar4;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pRVar8 = (Rgba *)operator_new__(uVar6);
  if (uVar4 != 0) {
    pRVar9 = pRVar8 + uVar4;
    local_a8 = pRVar8;
    do {
      Rgba::Rgba(local_a8);
      local_a8 = local_a8 + 1;
    } while (local_a8 != pRVar9);
  }
  *(Rgba **)(in_RDI + 0x168) = pRVar8;
  *(undefined8 *)(in_RDI + 0x170) = 0;
  *(undefined8 *)(in_RDI + 0x178) = 0;
  *(undefined8 *)(in_RDI + 0x180) = 0;
  return;
}

Assistant:

RgbaInputFile::FromYca::FromYca (InputFile &inputFile,
				 RgbaChannels rgbaChannels)
:
    _inputFile (inputFile)
{
    _readC = (rgbaChannels & WRITE_C)? true: false;

    const Box2i dw = _inputFile.header().dataWindow();

    _xMin = dw.min.x;
    _yMin = dw.min.y;
    _yMax = dw.max.y;
    _width  = dw.max.x - dw.min.x + 1;
    _height = dw.max.y - dw.min.y + 1;
    _currentScanLine = dw.min.y - N - 2;
    _lineOrder = _inputFile.header().lineOrder();
    _yw = ywFromHeader (_inputFile.header());

    ptrdiff_t pad = cachePadding (_width * sizeof (Rgba)) / sizeof (Rgba);

    _bufBase = new Rgba[(_width + pad) * (N + 2 + 3)];

    for (int i = 0; i < N + 2; ++i)
	_buf1[i] = _bufBase + (i * (_width + pad));
    
    for (int i = 0; i < 3; ++i)
	_buf2[i] = _bufBase + ((i + N + 2) * (_width + pad));

    _tmpBuf = new Rgba[_width + N - 1];

    _fbBase = 0;
    _fbXStride = 0;
    _fbYStride = 0;
}